

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

HighsStatus __thiscall
HighsSparseMatrix::assessIndexBounds(HighsSparseMatrix *this,HighsLogOptions *log_options)

{
  bool bVar1;
  HighsInt HVar2;
  reference pvVar3;
  uint *puVar4;
  HighsLogOptions *in_RSI;
  HighsSparseMatrix *in_RDI;
  HighsInt iEl;
  HighsInt num_nz;
  HighsInt num_vec;
  HighsInt vec_dim;
  HighsSparseMatrix *in_stack_ffffffffffffffb8;
  uint local_28;
  uint local_1c;
  
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    local_1c = in_RDI->num_row_;
  }
  else {
    local_1c = in_RDI->num_col_;
  }
  HVar2 = numNz(in_stack_ffffffffffffffb8);
  local_28 = 1;
  while( true ) {
    if (HVar2 <= (int)local_28) {
      return kOk;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)(int)local_28)
    ;
    if ((*pvVar3 < 0) ||
       (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->index_,(long)(int)local_28), (int)local_1c <= *pvVar3)) break;
    local_28 = local_28 + 1;
  }
  puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->index_,(long)(int)local_28);
  highsLogUser(in_RSI,kError,"Matrix index[%d] = %d is not in legal range of [0, %d)\n",
               (ulong)local_28,(ulong)*puVar4,(ulong)local_1c);
  return kError;
}

Assistant:

HighsStatus HighsSparseMatrix::assessIndexBounds(
    const HighsLogOptions& log_options) {
  // Identify main dimensions
  HighsInt vec_dim;
  HighsInt num_vec;
  if (this->isColwise()) {
    vec_dim = this->num_row_;
    //    num_vec = this->num_col_;
  } else {
    vec_dim = this->num_col_;
    //    num_vec = this->num_row_;
  }
  HighsInt num_nz = this->numNz();
  for (HighsInt iEl = 1; iEl < num_nz; iEl++) {
    if (this->index_[iEl] < 0 || this->index_[iEl] >= vec_dim) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix index[%d] = %d is not in legal range of [0, %d)\n",
                   int(iEl), int(this->index_[iEl]), vec_dim);
      return HighsStatus::kError;
    }
  }
  return HighsStatus::kOk;
}